

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall ByteCodeGenerator::LoadAllConstants(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  ByteCodeWriter *this_00;
  double d;
  byte bVar1;
  ushort uVar2;
  int iVar3;
  RegSlot value;
  Symbol *pSVar4;
  Scope *pSVar5;
  Type pSVar6;
  code *pcVar7;
  bool bVar8;
  RegSlot RVar9;
  BOOL BVar10;
  uint uVar11;
  FunctionBody *pFVar12;
  undefined4 *puVar13;
  Recycler *this_01;
  PropertyIdArray *propIds;
  Symbol *pSVar14;
  ulong uVar15;
  type_info *ptVar16;
  Type TVar17;
  int iVar18;
  uint uVar19;
  undefined1 local_70 [8];
  TrackAllocData data;
  bool local_34;
  
  pFVar12 = FuncInfo::GetParsedFunctionBody(funcInfo);
  Js::FunctionBody::CreateConstantTable(pFVar12);
  if (funcInfo->nullConstantRegister != 0xffffffff) {
    RVar9 = Js::FunctionBody::MapRegSlot(pFVar12,funcInfo->nullConstantRegister);
    Js::FunctionBody::RecordNullObject(pFVar12,RVar9);
  }
  if (funcInfo->undefinedConstantRegister != 0xffffffff) {
    RVar9 = Js::FunctionBody::MapRegSlot(pFVar12,funcInfo->undefinedConstantRegister);
    Js::FunctionBody::RecordUndefinedObject(pFVar12,RVar9);
  }
  if (funcInfo->trueConstantRegister != 0xffffffff) {
    RVar9 = Js::FunctionBody::MapRegSlot(pFVar12,funcInfo->trueConstantRegister);
    Js::FunctionBody::RecordTrueObject(pFVar12,RVar9);
  }
  if (funcInfo->falseConstantRegister != 0xffffffff) {
    RVar9 = Js::FunctionBody::MapRegSlot(pFVar12,funcInfo->falseConstantRegister);
    Js::FunctionBody::RecordFalseObject(pFVar12,RVar9);
  }
  if (funcInfo->frameObjRegister == 0xffffffff) {
    if ((funcInfo->frameSlotsRegister != 0xffffffff) &&
       (funcInfo->paramScope->scopeSlotCount == 0 && funcInfo->bodyScope->scopeSlotCount == 0)) {
      if (funcInfo->frameDisplayRegister == 0xffffffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x79c,"(funcInfo->frameDisplayRegister != Js::Constants::NoRegister)",
                           "Why do we need scope slots?");
        if (!bVar8) goto LAB_0080f8a5;
        *puVar13 = 0;
      }
      Js::ByteCodeWriter::Reg1(&this->m_writer,LdC_A_Null,funcInfo->frameSlotsRegister);
    }
  }
  else {
    Js::ByteCodeWriter::RecordObjectRegister(&this->m_writer,funcInfo->frameObjRegister);
    if ((funcInfo->field_0xb5 & 4) == 0) {
      EmitScopeObjectInit(this,funcInfo);
    }
    TVar17 = 0;
    pSVar14 = funcInfo->bodyScope->m_symList;
    while (pSVar14 != (Symbol *)0x0) {
      pSVar4 = pSVar14->next;
      bVar8 = Symbol::NeedsSlotAlloc(pSVar14,this,funcInfo);
      TVar17 = TVar17 + bVar8;
      pSVar14 = pSVar4;
    }
    if (funcInfo->paramScope != (Scope *)0x0) {
      pSVar14 = funcInfo->paramScope->m_symList;
      while (pSVar14 != (Symbol *)0x0) {
        pSVar4 = pSVar14->next;
        bVar8 = Symbol::NeedsSlotAlloc(pSVar14,this,funcInfo);
        TVar17 = TVar17 + bVar8;
        pSVar14 = pSVar4;
      }
    }
    bVar1 = (pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
    if (((((bVar1 & 0x10) != 0) && (pFVar12->byteCodeCache == (Type)0x0)) && ((bVar1 & 0x40) == 0))
       && ((pFVar12->super_ParseableFunctionInfo).scopeObjectSize != TVar17)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x792,
                         "(!byteCodeFunction->IsReparsed() || byteCodeFunction->HasGeneratedFromByteCodeCache() || byteCodeFunction->scopeObjectSize == count || byteCodeFunction->WasEverAsmJsMode())"
                         ,"The activation object size is different between debug and non-debug mode"
                        );
      if (!bVar8) goto LAB_0080f8a5;
      *puVar13 = 0;
    }
    (pFVar12->super_ParseableFunctionInfo).scopeObjectSize = TVar17;
  }
  pSVar5 = funcInfo->funcExprScope;
  if ((pSVar5 != (Scope *)0x0) && ((pSVar5->field_0x44 & 2) != 0)) {
    Js::FunctionBody::MapAndSetFuncExprScopeRegister(pFVar12,pSVar5->location);
    pFVar12->m_envDepth = 0xffff;
  }
  if ((funcInfo->field_0xb5 & 0x40) == 0) {
LAB_0080f24a:
    local_34 = false;
  }
  else {
    RVar9 = FuncInfo::GetEnvRegister(funcInfo);
    Js::FunctionBody::MapAndSetEnvRegister(pFVar12,RVar9);
    if ((funcInfo->field_0xb4 & 0x20) == 0) {
      bVar8 = FuncInfo::IsGlobalFunction(funcInfo);
      if ((bVar8) && ((this->flags & 0x400) == 0)) {
        RVar9 = FuncInfo::GetEnvRegister(funcInfo);
        if (RVar9 < funcInfo->varRegsCount) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x7b9,"(funcInfo->RegIsConst(funcInfo->GetEnvRegister()))",
                             "funcInfo->RegIsConst(funcInfo->GetEnvRegister())");
          if (!bVar8) goto LAB_0080f8a5;
          *puVar13 = 0;
        }
        uVar2 = *(ushort *)&(funcInfo->byteCodeFunction->super_FunctionProxy).field_0x45;
        RVar9 = FuncInfo::GetEnvRegister(funcInfo);
        RVar9 = Js::FunctionBody::MapRegSlot(pFVar12,RVar9);
        if ((uVar2 >> 8 & 1) == 0) {
          Js::FunctionBody::RecordNullDisplayConstant(pFVar12,RVar9);
        }
        else {
          Js::FunctionBody::RecordStrictNullDisplayConstant(pFVar12,RVar9);
        }
      }
      else {
        RVar9 = FuncInfo::GetEnvRegister(funcInfo);
        if (funcInfo->varRegsCount <= RVar9) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x7c7,"(!funcInfo->RegIsConst(funcInfo->GetEnvRegister()))",
                             "!funcInfo->RegIsConst(funcInfo->GetEnvRegister())");
          if (!bVar8) goto LAB_0080f8a5;
          *puVar13 = 0;
        }
        InvalidateCachedOuterScopes(this,funcInfo);
      }
      goto LAB_0080f24a;
    }
    if (funcInfo->thisSymbol != (Symbol *)0x0) {
      Js::FunctionBody::MapAndSetThisRegisterForEventHandler(pFVar12,funcInfo->thisSymbol->location)
      ;
    }
    RVar9 = FuncInfo::GetEnvRegister(funcInfo);
    if (funcInfo->varRegsCount <= RVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x7b3,"(!funcInfo->RegIsConst(funcInfo->GetEnvRegister()))",
                         "!funcInfo->RegIsConst(funcInfo->GetEnvRegister())");
      if (!bVar8) goto LAB_0080f8a5;
      *puVar13 = 0;
    }
    InvalidateCachedOuterScopes(this,funcInfo);
    local_34 = true;
  }
  if (funcInfo->frameDisplayRegister != 0xffffffff) {
    Js::ByteCodeWriter::RecordFrameDisplayRegister(&this->m_writer,funcInfo->frameDisplayRegister);
  }
  RecordAllIntConstants(this,funcInfo);
  RecordAllStrConstants(this,funcInfo);
  RecordAllBigIntConstants(this,funcInfo);
  RecordAllStringTemplateCallsiteConstants(this,funcInfo);
  if ((funcInfo->doubleConstantToRegister).bucketCount != 0) {
    uVar15 = 0;
    do {
      iVar18 = (funcInfo->doubleConstantToRegister).buckets[uVar15];
      while (iVar18 != -1) {
        pSVar6 = (funcInfo->doubleConstantToRegister).entries;
        iVar3 = pSVar6[iVar18].
                super_DefaultHashedEntry<double,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<double,_unsigned_int>.
                super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<double,_unsigned_int>_>
                .super_KeyValueEntryDataLayout2<double,_unsigned_int>.next;
        d = pSVar6[iVar18].
            super_DefaultHashedEntry<double,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<double,_unsigned_int>.
            super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<double,_unsigned_int>_>
            .super_KeyValueEntryDataLayout2<double,_unsigned_int>.key;
        RVar9 = Js::FunctionBody::MapRegSlot
                          (pFVar12,pSVar6[iVar18].
                                   super_DefaultHashedEntry<double,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                   .super_KeyValueEntry<double,_unsigned_int>.
                                   super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<double,_unsigned_int>_>
                                   .super_KeyValueEntryDataLayout2<double,_unsigned_int>.value);
        Js::FunctionBody::RecordFloatConstant(pFVar12,RVar9,d);
        iVar18 = iVar3;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (funcInfo->doubleConstantToRegister).bucketCount);
  }
  if ((funcInfo->field_0xb4 & 8) == 0) {
    bVar8 = FuncInfo::IsGlobalFunction(funcInfo);
    if (((!bVar8) && (bVar8 = IsInNonDebugMode(this), !bVar8)) &&
       (uVar19 = (uint)funcInfo->inArgsCount -
                 (uint)(funcInfo->root->pnodeRest == (ParseNodePtr)0x0), uVar19 != 0)) {
      if (0x3fffffff < uVar19) {
        Math::DefaultOverflowPolicy();
      }
      ptVar16 = (type_info *)(ulong)(uVar19 * 4);
      local_70 = (undefined1  [8])&Js::PropertyIdArray::typeinfo;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_35f8e87;
      data.filename._0_4_ = 0x7f1;
      data.typeinfo = ptVar16;
      this_01 = Memory::Recycler::TrackAllocInfo
                          (this->scriptContext->recycler,(TrackAllocData *)local_70);
      BVar10 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar10 == 0) {
        AssertCount = AssertCount + 1;
        data._32_8_ = ptVar16;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar8) goto LAB_0080f8a5;
        *puVar13 = 0;
        ptVar16 = (type_info *)data._32_8_;
      }
      propIds = (PropertyIdArray *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                          (this_01,(size_t)(ptVar16 + 8));
      if (propIds == (PropertyIdArray *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x20d,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar8) goto LAB_0080f8a5;
        *puVar13 = 0;
      }
      propIds->count = uVar19;
      propIds->extraSlots = '\0';
      propIds->hadDuplicates = false;
      propIds->has__proto__ = false;
      propIds->hasNonSimpleParams = false;
      GetFormalArgsArray(this,funcInfo,propIds);
      Js::FunctionBody::SetPropertyIdsOfFormals(pFVar12,propIds);
    }
  }
  else {
    if (funcInfo->argumentsSymbol == (Symbol *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x7e3,"(sym)","sym");
      if (!bVar8) goto LAB_0080f8a5;
      *puVar13 = 0;
    }
    if ((funcInfo->field_0xb4 & 0x10) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x7e4,"(funcInfo->GetHasHeapArguments())",
                         "funcInfo->GetHasHeapArguments()");
      if (!bVar8) goto LAB_0080f8a5;
      *puVar13 = 0;
    }
    if ((*(uint *)&funcInfo->field_0xb4 & 0x402) != 0x400) {
      LoadHeapArguments(this,funcInfo);
    }
  }
  BVar10 = FuncInfo::IsClassConstructor(funcInfo);
  if (BVar10 != 0) {
    Js::ByteCodeWriter::Empty(&this->m_writer,ChkNewCallFlag);
  }
  if (funcInfo->newTargetSymbol != (Symbol *)0x0) {
    LoadNewTargetObject(this,funcInfo);
  }
  if (funcInfo->thisSymbol == (Symbol *)0x0) {
    bVar8 = ShouldLoadConstThis(this,funcInfo);
    if (bVar8) {
      EmitThis(this,funcInfo,funcInfo->thisConstantRegister,funcInfo->nullConstantRegister);
    }
  }
  else {
    LoadThisObject(this,funcInfo,local_34);
  }
  if (funcInfo->superSymbol != (Symbol *)0x0) {
    LoadSuperObject(this,funcInfo);
  }
  if (funcInfo->superConstructorSymbol != (Symbol *)0x0) {
    LoadSuperConstructorObject(this,funcInfo);
  }
  if (funcInfo->importMetaSymbol != (Symbol *)0x0) {
    LoadImportMetaObject(this,funcInfo);
  }
  pSVar14 = ParseNodeFnc::GetFuncSymbol(funcInfo->root);
  bVar8 = FuncInfo::IsGlobalFunction(funcInfo);
  if (((pSVar14 != (Symbol *)0x0 && !bVar8) && ((pSVar14->field_0x42 & 0x20) != 0)) &&
     (((funcInfo->field_0xb5 & 2) != 0 ||
      ((funcInfo->funcExprScope != (Scope *)0x0 && ((funcInfo->funcExprScope->field_0x44 & 2) != 0))
      )))) {
    this_00 = &this->m_writer;
    Js::ByteCodeWriter::Reg1(this_00,LdFuncExpr,pSVar14->location);
    bVar8 = Symbol::IsInSlot(pSVar14,this,funcInfo,false);
    if (!bVar8) {
      bVar8 = ShouldTrackDebuggerMetadata(this);
      if (!bVar8) {
        return;
      }
      pFVar12 = (FunctionBody *)funcInfo->byteCodeFunction;
      bVar8 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar12);
      if (!bVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
        if (!bVar8) goto LAB_0080f8a5;
        *puVar13 = 0;
      }
      Js::FunctionBody::InsertSymbolToRegSlotList
                (pFVar12,&pSVar14->name,pSVar14->location,funcInfo->varRegsCount);
      return;
    }
    if (funcInfo->funcExprScope == (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x839,"(funcInfo->funcExprScope)","funcInfo->funcExprScope");
      if (!bVar8) goto LAB_0080f8a5;
      *puVar13 = 0;
    }
    if ((funcInfo->funcExprScope->field_0x44 & 2) == 0) {
      uVar2 = *(ushort *)&funcInfo->paramScope->field_0x44;
      if (((uVar2 & 2) == 0) &&
         (((uVar2 & 0x14) != 4 || ((funcInfo->bodyScope->field_0x44 & 2) == 0)))) {
        if (pSVar14->scopeSlot == -1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x848,"(sym->HasScopeSlot())","sym->HasScopeSlot()");
          if (!bVar8) {
LAB_0080f8a5:
            pcVar7 = (code *)invalidInstructionException();
            (*pcVar7)();
          }
          *puVar13 = 0;
        }
        Js::ByteCodeWriter::SlotI1(this_00,StLocalSlot,pSVar14->location,pSVar14->scopeSlot + 2);
      }
      else {
        RVar9 = pSVar14->location;
        uVar11 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,pSVar14->position);
        Js::ByteCodeWriter::ElementU(this_00,StLocalFuncExpr,RVar9,uVar11);
      }
    }
    else {
      RVar9 = funcInfo->funcExprScope->location;
      value = pSVar14->location;
      uVar11 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,pSVar14->position);
      Js::ByteCodeWriter::Property(this_00,StFuncExpr,value,RVar9,uVar11,false);
    }
  }
  return;
}

Assistant:

void ByteCodeGenerator::LoadAllConstants(FuncInfo *funcInfo)
{
    Symbol *sym;

    Js::FunctionBody *byteCodeFunction = funcInfo->GetParsedFunctionBody();
    byteCodeFunction->CreateConstantTable();

    if (funcInfo->nullConstantRegister != Js::Constants::NoRegister)
    {
        byteCodeFunction->RecordNullObject(byteCodeFunction->MapRegSlot(funcInfo->nullConstantRegister));
    }

    if (funcInfo->undefinedConstantRegister != Js::Constants::NoRegister)
    {
        byteCodeFunction->RecordUndefinedObject(byteCodeFunction->MapRegSlot(funcInfo->undefinedConstantRegister));
    }

    if (funcInfo->trueConstantRegister != Js::Constants::NoRegister)
    {
        byteCodeFunction->RecordTrueObject(byteCodeFunction->MapRegSlot(funcInfo->trueConstantRegister));
    }

    if (funcInfo->falseConstantRegister != Js::Constants::NoRegister)
    {
        byteCodeFunction->RecordFalseObject(byteCodeFunction->MapRegSlot(funcInfo->falseConstantRegister));
    }

    if (funcInfo->frameObjRegister != Js::Constants::NoRegister)
    {
        m_writer.RecordObjectRegister(funcInfo->frameObjRegister);
        if (!funcInfo->GetApplyEnclosesArgs())
        {
            this->EmitScopeObjectInit(funcInfo);
        }

#if DBG
        uint count = 0;
        funcInfo->GetBodyScope()->ForEachSymbol([&](Symbol *const sym)
        {
            if (sym->NeedsSlotAlloc(this, funcInfo))
            {
                // All properties should get correct propertyId here.
                count++;
            }
        });

        if (funcInfo->GetParamScope() != nullptr)
        {
            funcInfo->GetParamScope()->ForEachSymbol([&](Symbol *const sym)
            {
                if (sym->NeedsSlotAlloc(this, funcInfo))
                {
                    // All properties should get correct propertyId here.
                    count++;
                }
            });
        }

        // A reparse should result in the same size of the activation object.
        // Exclude functions which were created from the ByteCodeCache.
        AssertMsg(!byteCodeFunction->IsReparsed() || byteCodeFunction->HasGeneratedFromByteCodeCache() ||
            byteCodeFunction->scopeObjectSize == count || byteCodeFunction->WasEverAsmJsMode(),
            "The activation object size is different between debug and non-debug mode");
        byteCodeFunction->scopeObjectSize = count;
#endif
    }
    else if (funcInfo->frameSlotsRegister != Js::Constants::NoRegister)
    {
        int scopeSlotCount = funcInfo->bodyScope->GetScopeSlotCount();
        int paramSlotCount = funcInfo->paramScope->GetScopeSlotCount();
        if (scopeSlotCount == 0 && paramSlotCount == 0)
        {
            AssertMsg(funcInfo->frameDisplayRegister != Js::Constants::NoRegister, "Why do we need scope slots?");
            m_writer.Reg1(Js::OpCode::LdC_A_Null, funcInfo->frameSlotsRegister);
        }
    }

    if (funcInfo->funcExprScope && funcInfo->funcExprScope->GetIsObject())
    {
        byteCodeFunction->MapAndSetFuncExprScopeRegister(funcInfo->funcExprScope->GetLocation());
        byteCodeFunction->SetEnvDepth((uint16)-1);
    }

    bool thisLoadedFromParams = false;

    if (funcInfo->NeedEnvRegister())
    {
        byteCodeFunction->MapAndSetEnvRegister(funcInfo->GetEnvRegister());
        if (funcInfo->GetIsTopLevelEventHandler())
        {
            if (funcInfo->GetThisSymbol())
            {
                byteCodeFunction->MapAndSetThisRegisterForEventHandler(funcInfo->GetThisSymbol()->GetLocation());
            }
            // The environment is the namespace hierarchy starting with "this".
            Assert(!funcInfo->RegIsConst(funcInfo->GetEnvRegister()));
            thisLoadedFromParams = true;
            this->InvalidateCachedOuterScopes(funcInfo);
        }
        else if (funcInfo->IsGlobalFunction() && !(this->flags & fscrEval))
        {
            Assert(funcInfo->RegIsConst(funcInfo->GetEnvRegister()));

            if (funcInfo->GetIsStrictMode())
            {
                byteCodeFunction->RecordStrictNullDisplayConstant(byteCodeFunction->MapRegSlot(funcInfo->GetEnvRegister()));
            }
            else
            {
                byteCodeFunction->RecordNullDisplayConstant(byteCodeFunction->MapRegSlot(funcInfo->GetEnvRegister()));
            }
        }
        else
        {
            // environment may be required to load "this"
            Assert(!funcInfo->RegIsConst(funcInfo->GetEnvRegister()));
            this->InvalidateCachedOuterScopes(funcInfo);
        }
    }

    if (funcInfo->frameDisplayRegister != Js::Constants::NoRegister)
    {
        m_writer.RecordFrameDisplayRegister(funcInfo->frameDisplayRegister);
    }

    this->RecordAllIntConstants(funcInfo);
    this->RecordAllStrConstants(funcInfo);
    this->RecordAllBigIntConstants(funcInfo);
    this->RecordAllStringTemplateCallsiteConstants(funcInfo);

    funcInfo->doubleConstantToRegister.Map([byteCodeFunction](double d, Js::RegSlot location)
    {
        byteCodeFunction->RecordFloatConstant(byteCodeFunction->MapRegSlot(location), d);
    });

    // WARNING !!!
    // DO NOT emit any bytecode before loading the heap arguments. This is because those opcodes may bail 
    // out (unlikely, since opcodes emitted in this function should not correspond to user code, but possible)
    // and the Jit assumes that there cannot be any bailouts before LdHeapArguments (or its equivalent)

    if (funcInfo->GetHasArguments())
    {
        sym = funcInfo->GetArgumentsSymbol();
        Assert(sym);
        Assert(funcInfo->GetHasHeapArguments());

        if (funcInfo->GetCallsEval() || (!funcInfo->GetApplyEnclosesArgs()))
        {
            this->LoadHeapArguments(funcInfo);
        }

    }
    else if (!funcInfo->IsGlobalFunction() && !IsInNonDebugMode())
    {
        uint count = funcInfo->inArgsCount + (funcInfo->root->pnodeRest != nullptr ? 1 : 0) - 1;
        if (count != 0)
        {
            Js::PropertyIdArray *propIds = RecyclerNewPlus(scriptContext->GetRecycler(), UInt32Math::Mul(count, sizeof(Js::PropertyId)), Js::PropertyIdArray, count, 0);

            GetFormalArgsArray(this, funcInfo, propIds);
            byteCodeFunction->SetPropertyIdsOfFormals(propIds);
        }
    }

    // Class constructors do not have a [[call]] slot but we don't implement a generic way to express this.
    // What we do is emit a check for the new flag here. If we don't have CallFlags_New set, the opcode will throw.
    // We need to do this before emitting 'this' since the base class constructor will try to construct a new object.
    if (funcInfo->IsClassConstructor())
    {
        m_writer.Empty(Js::OpCode::ChkNewCallFlag);
    }

    // new.target may be used to construct the 'this' register so make sure to load it first
    if (funcInfo->GetNewTargetSymbol())
    {
        this->LoadNewTargetObject(funcInfo);
    }

    if (funcInfo->GetThisSymbol())
    {
        this->LoadThisObject(funcInfo, thisLoadedFromParams);
    }
    else if (ShouldLoadConstThis(funcInfo))
    {
        this->EmitThis(funcInfo, funcInfo->thisConstantRegister, funcInfo->nullConstantRegister);
    }

    if (funcInfo->GetSuperSymbol())
    {
        this->LoadSuperObject(funcInfo);
    }

    if (funcInfo->GetSuperConstructorSymbol())
    {
        this->LoadSuperConstructorObject(funcInfo);
    }

    if (funcInfo->GetImportMetaSymbol())
    {
        this->LoadImportMetaObject(funcInfo);
    }

    //
    // If the function is a function expression with a name,
    // load the function object at runtime to its activation object.
    //
    sym = funcInfo->root->GetFuncSymbol();
    bool funcExprWithName = !funcInfo->IsGlobalFunction() && sym && sym->GetIsFuncExpr();

    if (funcExprWithName)
    {
        if (funcInfo->GetFuncExprNameReference() ||
            (funcInfo->funcExprScope && funcInfo->funcExprScope->GetIsObject()))
        {
            //
            // x = function f(...) { ... }
            // A named function expression's name (Symbol:f) belongs to the enclosing scope.
            // Thus there are no uses of 'f' within the scope of the function (as references to 'f'
            // are looked up in the closure). So, we can't use f's register as it is from the enclosing
            // scope's register namespace. So use a tmp register.
            // In ES5 mode though 'f' is *not* a part of the enclosing scope. So we always assign 'f' a register
            // from it's register namespace, which LdFuncExpr can use.
            //
            Js::RegSlot ldFuncExprDst = sym->GetLocation();
            this->m_writer.Reg1(Js::OpCode::LdFuncExpr, ldFuncExprDst);

            if (sym->IsInSlot(this, funcInfo))
            {
                Js::RegSlot scopeLocation;
                AnalysisAssert(funcInfo->funcExprScope);

                if (funcInfo->funcExprScope->GetIsObject())
                {
                    scopeLocation = funcInfo->funcExprScope->GetLocation();
                    this->m_writer.Property(Js::OpCode::StFuncExpr, sym->GetLocation(), scopeLocation,
                        funcInfo->FindOrAddReferencedPropertyId(sym->GetPosition()));
                }
                else if (funcInfo->paramScope->GetIsObject() || (funcInfo->paramScope->GetCanMerge() && funcInfo->bodyScope->GetIsObject()))
                {
                    this->m_writer.ElementU(Js::OpCode::StLocalFuncExpr, sym->GetLocation(),
                        funcInfo->FindOrAddReferencedPropertyId(sym->GetPosition()));
                }
                else
                {
                    Assert(sym->HasScopeSlot());
                    this->m_writer.SlotI1(Js::OpCode::StLocalSlot, sym->GetLocation(),
                                          sym->GetScopeSlot() + Js::ScopeSlots::FirstSlotIndex);
                }
            }
            else if (ShouldTrackDebuggerMetadata())
            {
                funcInfo->byteCodeFunction->GetFunctionBody()->InsertSymbolToRegSlotList(sym->GetName(), sym->GetLocation(), funcInfo->varRegsCount);
            }
        }
    }
}